

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscroller.cpp
# Opt level: O1

void __thiscall QScroller::setScrollerProperties(QScroller *this,QScrollerProperties *sp)

{
  QScrollerProperties *this_00;
  QScrollerPrivate *this_01;
  bool bVar1;
  long in_FS_OFFSET;
  void *local_38;
  QScrollerProperties *pQStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = this->d_ptr;
  this_00 = &this_01->properties;
  bVar1 = QScrollerProperties::operator!=(this_00,sp);
  if (bVar1) {
    QScrollerProperties::operator=(this_00,sp);
    local_38 = (void *)0x0;
    pQStack_30 = sp;
    QMetaObject::activate(&this->super_QObject,&staticMetaObject,1,&local_38);
    QScrollerPrivate::recalcScrollingSegments(this_01,true);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QScroller::setScrollerProperties(const QScrollerProperties &sp)
{
    Q_D(QScroller);
    if (d->properties != sp) {
        d->properties = sp;
        emit scrollerPropertiesChanged(sp);

        // we need to force the recalculation here, since the overshootPolicy may have changed and
        // existing segments may include an overshoot animation.
        d->recalcScrollingSegments(true);
    }
}